

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O2

void cmAddCustomCommandToTarget
               (void *arg,char *target,char *command,int numArgs,char **args,int commandType)

{
  _Head_base<0UL,_cmCustomCommand_*,_false> this;
  string *psVar1;
  ulong uVar2;
  cmCustomCommandType type;
  __single_object cc;
  cmCustomCommandLine commandLine;
  cmCustomCommandLines commandLines;
  string expand;
  allocator<char> local_e1;
  _Head_base<0UL,_cmCustomCommand_*,_false> local_e0;
  int local_d4;
  __uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  char *local_b0;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_a8;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_88;
  string local_70;
  string local_50;
  
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b0 = target;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,command,(allocator<char> *)&local_70);
  local_d4 = commandType;
  psVar1 = cmMakefile::ExpandVariablesInString((cmMakefile *)arg,&local_50);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_c8,psVar1);
  uVar2 = 0;
  if (numArgs < 1) {
    numArgs = 0;
  }
  for (; (uint)numArgs != uVar2; uVar2 = uVar2 + 1) {
    std::__cxx11::string::assign((char *)&local_50);
    psVar1 = cmMakefile::ExpandVariablesInString((cmMakefile *)arg,&local_50);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_c8,psVar1);
  }
  local_a8.super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
            (&local_a8,(value_type *)&local_c8);
  type = (local_d4 != 1) + PRE_LINK;
  if (local_d4 == 0) {
    type = PRE_BUILD;
  }
  std::make_unique<cmCustomCommand>();
  this._M_head_impl = local_e0._M_head_impl;
  std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::vector
            (&local_88,&local_a8);
  cmCustomCommand::SetCommandLines(this._M_head_impl,(cmCustomCommandLines *)&local_88);
  std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,local_b0,&local_e1);
  local_d0._M_t.super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
  super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
       (tuple<cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>)
       (tuple<cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>)local_e0._M_head_impl;
  local_e0._M_head_impl = (cmCustomCommand *)0x0;
  cmMakefile::AddCustomCommandToTarget
            ((cmMakefile *)arg,&local_70,type,
             (unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&local_d0);
  std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
            ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&local_d0);
  std::__cxx11::string::~string((string *)&local_70);
  std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
            ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&local_e0);
  std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_a8);
  std::__cxx11::string::~string((string *)&local_50);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c8);
  return;
}

Assistant:

static void CCONV cmAddCustomCommandToTarget(void* arg, const char* target,
                                             const char* command, int numArgs,
                                             const char** args,
                                             int commandType)
{
  // Get the makefile instance.
  cmMakefile* mf = static_cast<cmMakefile*>(arg);

  // Construct the command line for the command.  Perform an extra
  // variable expansion now because the API caller expects it.
  cmCustomCommandLine commandLine;
  std::string expand = command;
  commandLine.push_back(mf->ExpandVariablesInString(expand));
  for (int i = 0; i < numArgs; ++i) {
    expand = args[i];
    commandLine.push_back(mf->ExpandVariablesInString(expand));
  }
  cmCustomCommandLines commandLines;
  commandLines.push_back(commandLine);

  // Select the command type.
  cmCustomCommandType cctype = cmCustomCommandType::POST_BUILD;
  switch (commandType) {
    case CM_PRE_BUILD:
      cctype = cmCustomCommandType::PRE_BUILD;
      break;
    case CM_PRE_LINK:
      cctype = cmCustomCommandType::PRE_LINK;
      break;
    case CM_POST_BUILD:
      cctype = cmCustomCommandType::POST_BUILD;
      break;
  }

  // Pass the call to the makefile instance.
  auto cc = cm::make_unique<cmCustomCommand>();
  cc->SetCommandLines(commandLines);
  mf->AddCustomCommandToTarget(target, cctype, std::move(cc));
}